

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::SimpleAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,
          Type *elementType,SourceRange sourceRange)

{
  ulong uVar1;
  SourceRange sourceRange_00;
  SimpleAssignmentPatternExpression *expr;
  Expression *pEVar2;
  bool isLValue;
  bool bad;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  bool *in_stack_ffffffffffffffc0;
  bool local_32;
  char local_31;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_30;
  
  uVar1 = (context->flags).m_bits;
  local_32 = SUB41(((uint)uVar1 & 0x100000) >> 0x14,0);
  if ((uVar1 & 0x100000) == 0) {
    local_31 = '\0';
    sourceRange_00.endLoc = (SourceLocation)&local_31;
    sourceRange_00.startLoc = sourceRange.endLoc;
    local_30 = bindExpressionList((ast *)type,elementType,(Type *)0x1,0,(int)syntax + 0x28,
                                  (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)context,
                                  (ASTContext *)sourceRange.startLoc,sourceRange_00,
                                  in_stack_ffffffffffffffc0);
    expr = BumpAllocator::
           emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                     (&comp->super_BumpAllocator,type,&local_32,&local_30,&sourceRange);
    if (local_31 == '\x01') {
      expr = (SimpleAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)expr);
    }
    return (Expression *)expr;
  }
  ASTContext::addDiag(context,(DiagCode)0x130007,sourceRange);
  pEVar2 = Expression::badExpr(comp,(Expression *)0x0);
  return pEVar2;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    if (isLValue) {
        context.addDiag(diag::AssignmentPatternLValueDynamic, sourceRange);
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, 1, 0, syntax.items, context, sourceRange,
                                    bad);

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, isLValue, elems,
                                                                  sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}